

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall kj::anon_unknown_31::WebSocketImpl::close(WebSocketImpl *this,int __fd)

{
  void *in_RCX;
  int in_EDX;
  long in_R8;
  ArrayPtr<const_unsigned_char> message;
  Array<unsigned_char> payload;
  Promise<void> promise;
  
  payload.ptr = (uchar *)0x0;
  payload.size_ = 0;
  payload.disposer = (ArrayDisposer *)0x0;
  if (in_EDX == 0x3ed) {
    if (in_R8 != 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[47]>
                ((Fault *)&promise,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x7da,FAILED,"reason.size() == 0",
                 "\"WebSocket close code 1005 cannot have a reason\"",
                 (char (*) [47])"WebSocket close code 1005 cannot have a reason");
      _::Debug::Fault::fatal((Fault *)&promise);
    }
  }
  else {
    promise.super_PromiseBase.node.disposer =
         (Disposer *)_::HeapArrayDisposer::allocate<unsigned_char>(in_R8 + 1U);
    promise.super_PromiseBase.node.ptr = (PromiseNode *)(in_R8 + 1U);
    Array<unsigned_char>::operator=(&payload,(Array<unsigned_char> *)&promise);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&promise);
    *payload.ptr = (uchar)((uint)in_EDX >> 8);
    payload.ptr[1] = (uchar)in_EDX;
    memcpy(payload.ptr + 2,in_RCX,in_R8 - 1);
  }
  message.size_ = (size_t)payload.ptr;
  message.ptr = (uchar *)0x8;
  sendImpl((WebSocketImpl *)&promise,(byte)__fd,message);
  Promise<void>::attach<kj::Array<unsigned_char>>
            ((Promise<void> *)this,(Array<unsigned_char> *)&promise);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  Array<unsigned_char>::~Array(&payload);
  return (int)this;
}

Assistant:

kj::Promise<void> close(uint16_t code, kj::StringPtr reason) override {
    kj::Array<byte> payload;
    if (code == 1005) {
      KJ_REQUIRE(reason.size() == 0, "WebSocket close code 1005 cannot have a reason");

      // code 1005 -- leave payload empty
    } else {
      payload = heapArray<byte>(reason.size() + 2);
      payload[0] = code >> 8;
      payload[1] = code;
      memcpy(payload.begin() + 2, reason.begin(), reason.size());
    }

    auto promise = sendImpl(OPCODE_CLOSE, payload);
    return promise.attach(kj::mv(payload));
  }